

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

UBool icu_63::uspoof_cleanupDefaultData(void)

{
  if (gDefaultSpoofData != (SpoofData *)0x0) {
    SpoofData::removeReference(gDefaultSpoofData);
    gDefaultSpoofData = (SpoofData *)0x0;
    UInitOnce::reset((UInitOnce *)&gSpoofInitDefaultOnce);
  }
  return '\x01';
}

Assistant:

static UBool U_CALLCONV
uspoof_cleanupDefaultData(void) {
    if (gDefaultSpoofData) {
        // Will delete, assuming all user-level spoof checkers were closed.
        gDefaultSpoofData->removeReference();
        gDefaultSpoofData = nullptr;
        gSpoofInitDefaultOnce.reset();
    }
    return TRUE;
}